

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultFunctionPortSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DefaultFunctionPortSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Token keyword;
  DefaultFunctionPortSyntax *pDVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pDVar1 = (DefaultFunctionPortSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  keyword.info = in_RSI;
  keyword._0_8_ = in_RSI->location;
  slang::syntax::DefaultFunctionPortSyntax::DefaultFunctionPortSyntax
            ((DefaultFunctionPortSyntax *)in_RSI->rawTextPtr,keyword);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }